

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O0

void __thiscall CVmImageLoader::load_funcset_dep(CVmImageLoader *this,ulong siz)

{
  uint uVar1;
  CVmBifTable *in_RDI;
  uint len;
  uint i;
  uint entry_cnt;
  char buf [256];
  ulong *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed8;
  uint in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  uint uVar2;
  undefined4 in_stack_fffffffffffffee4;
  byte local_118 [32];
  char *in_stack_ffffffffffffff08;
  CVmBifTable *in_stack_ffffffffffffff10;
  
  if (((byte)in_RDI[4].count_ >> 1 & 1) != 0) {
    err_throw(0);
  }
  *(byte *)&in_RDI[4].count_ = (byte)in_RDI[4].count_ & 0xfd | 2;
  CVmBifTable::clear(in_RDI);
  read_data((CVmImageLoader *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
            (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),(size_t)in_RDI,
            in_stack_fffffffffffffec8);
  uVar1 = ::osrp2(local_118);
  for (uVar2 = 0; uVar2 < uVar1; uVar2 = uVar2 + 1) {
    read_data((CVmImageLoader *)CONCAT44(uVar1,uVar2),
              (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),(size_t)in_RDI,
              in_stack_fffffffffffffec8);
    in_stack_fffffffffffffedc = (uint)local_118[0];
    read_data((CVmImageLoader *)CONCAT44(uVar1,uVar2),
              (char *)(ulong)CONCAT14(local_118[0],in_stack_fffffffffffffed8),(size_t)in_RDI,
              in_stack_fffffffffffffec8);
    local_118[in_stack_fffffffffffffedc] = 0;
    CVmBifTable::add_entry(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  }
  return;
}

Assistant:

void CVmImageLoader::load_funcset_dep(VMG_ ulong siz)
{
    char buf[256];
    uint entry_cnt;
    uint i;

    /* it's an error if we've already seen a dependency block */
    if (loaded_funcset_dep_)
        err_throw(VMERR_IMAGE_FUNCDEP_REDEF);

    /* note that we've loaded a dependency block */
    loaded_funcset_dep_ = TRUE;

    /* 
     *   reset the global function set dependency table, in case there was
     *   anything defined by a previously-loaded image - since a function
     *   set index in the table is implicit in the load order, we need to
     *   make sure we're starting with a completely clean configuration 
     */
    G_bif_table->clear(vmg0_);

    /* read the number of entries in the table */
    read_data(buf, 2, &siz);
    entry_cnt = osrp2(buf);

    /* read the entries */
    for (i = 0 ; i < entry_cnt ; ++i)
    {
        uint len;

        /* read the length of the entry */
        read_data(buf, 1, &siz);
        len = (uchar)buf[0];

        /* read the name and null-terminate it */
        read_data(buf, len, &siz);
        buf[len] = '\0';

        /* add the dependency */
        G_bif_table->add_entry(vmg_ buf);
    }
}